

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugstream.cpp
# Opt level: O0

void __thiscall MetaSim::DebugStream::DebugStream(DebugStream *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &std::cerr;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1f4c19);
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[9] = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1f4c44);
  Tick::Tick((Tick *)(in_RDI + 10),0);
  Tick::Tick((Tick *)(in_RDI + 0xb),0x7fffffffffffffff);
  return;
}

Assistant:

DebugStream::DebugStream() : 
        _os(&cerr),
        _autodelete(false),
        _isDebug(false),
        _isDebugAll(false),
        _isIndenting(false),
        _indentLevel(0),
        _dbgLevels(),
        _dbgStack(),
        _t1(0),
        _t2(MAXTICK)
    {    
    }